

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O2

QList<QTextEdit::ExtraSelection> * __thiscall
QWidgetTextControl::extraSelections
          (QList<QTextEdit::ExtraSelection> *__return_storage_ptr__,QWidgetTextControl *this)

{
  long lVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  undefined1 local_58 [16];
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (ExtraSelection *)0x0;
  uVar5 = *(ulong *)(lVar1 + 0x130);
  iVar3 = (int)uVar5;
  QList<QTextEdit::ExtraSelection>::reserve(__return_storage_ptr__,(long)iVar3);
  uVar4 = 0;
  uVar5 = uVar5 & 0xffffffff;
  if (iVar3 < 1) {
    uVar5 = uVar4;
  }
  for (; uVar5 * 0x18 - uVar4 != 0; uVar4 = uVar4 + 0x18) {
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QTextEdit::ExtraSelection::ExtraSelection((ExtraSelection *)local_58);
    lVar2 = *(long *)(lVar1 + 0x128);
    QTextCursor::operator=((QTextCursor *)local_58,(QTextCursor *)(lVar2 + uVar4));
    QTextFormat::operator=((QTextFormat *)(local_58 + 8),(QTextFormat *)(lVar2 + uVar4 + 8));
    QList<QTextEdit::ExtraSelection>::emplaceBack<QTextEdit::ExtraSelection_const&>
              (__return_storage_ptr__,(ExtraSelection *)local_58);
    QTextEdit::ExtraSelection::~ExtraSelection((ExtraSelection *)local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QTextEdit::ExtraSelection> QWidgetTextControl::extraSelections() const
{
    Q_D(const QWidgetTextControl);
    QList<QTextEdit::ExtraSelection> selections;
    const int numExtraSelections = d->extraSelections.size();
    selections.reserve(numExtraSelections);
    for (int i = 0; i < numExtraSelections; ++i) {
        QTextEdit::ExtraSelection sel;
        const QAbstractTextDocumentLayout::Selection &sel2 = d->extraSelections.at(i);
        sel.cursor = sel2.cursor;
        sel.format = sel2.format;
        selections.append(sel);
    }
    return selections;
}